

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O2

void __thiscall wasm::SSAify::computeGetsAndPhis(SSAify *this,LocalGraph *graph)

{
  Locations *this_00;
  Id index;
  _Base_ptr p_Var1;
  LocalSet *pLVar2;
  bool bVar3;
  Id index_00;
  _Rb_tree_const_iterator<wasm::LocalSet_*> _Var4;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *this_01;
  Expression *pEVar5;
  mapped_type *pppEVar6;
  LocalSet *pLVar7;
  size_type sVar8;
  Type TVar9;
  LocalGet *value_00;
  _Base_ptr p_Var10;
  LocalSet **ppLVar11;
  undefined1 local_c8 [8];
  Iterator __end3;
  FindAll<wasm::LocalGet> gets;
  undefined1 local_70 [8];
  Iterator __begin3;
  Builder builder;
  LocalSet *local_40;
  Expression *value;
  LocalGet *get;
  
  FindAll<wasm::LocalGet>::FindAll
            ((FindAll<wasm::LocalGet> *)&__end3.flexibleIterator,this->func->body);
  this_00 = &graph->locations;
  _Var4 = __end3.flexibleIterator;
  do {
    if (_Var4._M_node ==
        (_Base_ptr)
        gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::~_Vector_base
                ((_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                 &__end3.flexibleIterator);
      return;
    }
    value = *(Expression **)_Var4._M_node;
    this_01 = &std::__detail::
               _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)graph,(key_type *)&value)->
               super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ;
    p_Var1 = (_Base_ptr)(this_01->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var10 = p_Var1;
    if (p_Var1 == (_Base_ptr)0x0) {
      p_Var10 = (_Base_ptr)(this_01->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
    }
    if (p_Var10 != (_Base_ptr)0x0) {
      if (p_Var10 == (_Base_ptr)0x1) {
        p_Var10 = p_Var1;
        if (p_Var1 != (_Base_ptr)0x0) {
          p_Var10 = (this_01->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        p_Var10 = p_Var10 + 1;
        if (p_Var1 == (_Base_ptr)0x0) {
          p_Var10 = (_Base_ptr)
                    &(this_01->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
        }
        if (*(long *)p_Var10 == 0) {
          bVar3 = Function::isParam(this->func,value[1]._id);
          if ((!bVar3) && (bVar3 = LiteralUtils::canMakeZero((Type)(value->type).id), bVar3)) {
            pEVar5 = LiteralUtils::makeZero((Type)(value->type).id,this->module);
            local_70 = (undefined1  [8])value;
            pppEVar6 = std::
                       map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                       ::operator[](this_00,(key_type *)local_70);
            **pppEVar6 = pEVar5;
          }
        }
        else {
          value[1]._id = *(Id *)(*(long *)p_Var10 + 0x10);
        }
      }
      else if (this->allowMerges == true) {
        index_00 = addLocal(this,(Type)(value->type).id);
        index = value[1]._id;
        value[1]._id = index_00;
        __begin3.flexibleIterator._M_node = (_Base_ptr)this->module;
        __begin3.fixedIndex = 0;
        __begin3.parent._0_1_ =
             (this_01->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
        if ((bool)(char)__begin3.parent) {
          __begin3.usingFixed = false;
          __begin3._9_7_ = 0;
        }
        else {
          __begin3.fixedIndex =
               (size_t)(this_01->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        local_70 = (undefined1  [8])this_01;
        SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        ::end((Iterator *)local_c8,this_01);
        while (bVar3 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                       ::
                       IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                       ::operator!=((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                     *)local_70,(Iterator *)local_c8), bVar3) {
          ppLVar11 = (LocalSet **)(__begin3.fixedIndex + 0x20);
          if ((char)__begin3.parent != '\0') {
            ppLVar11 = (((OrderedFixedStorage<wasm::LocalSet_*,_2UL> *)local_70)->
                       super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems +
                       __begin3._8_8_;
          }
          pLVar2 = *ppLVar11;
          if (pLVar2 == (LocalSet *)0x0) {
            bVar3 = Function::isParam(this->func,index);
            if (bVar3) {
              TVar9 = Function::getLocalType(this->func,index);
              value_00 = MixedArena::alloc<wasm::LocalGet>
                                   ((MixedArena *)&__begin3.flexibleIterator._M_node[10]._M_right);
              value_00->index = index;
              (value_00->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id
                   = TVar9.id;
              local_40 = Builder::makeLocalSet
                                   ((Builder *)&__begin3.flexibleIterator,index_00,
                                    (Expression *)value_00);
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                         &this->functionPrepends,(Expression **)&local_40);
            }
          }
          else {
            local_40 = (LocalSet *)pLVar2->value;
            pLVar7 = Builder::makeLocalTee
                               ((Builder *)&__begin3.flexibleIterator,index_00,
                                (Expression *)local_40,(Type)(value->type).id);
            pLVar2->value = (Expression *)pLVar7;
            sVar8 = std::
                    map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                    ::count(this_00,(key_type *)&local_40);
            if (sVar8 != 0) {
              pppEVar6 = std::
                         map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                         ::operator[](this_00,(key_type *)&local_40);
              if (*pppEVar6 != &pLVar2->value) {
                __assert_fail("graph.locations[value] == &set->value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SSAify.cpp"
                              ,0xab,"void wasm::SSAify::computeGetsAndPhis(LocalGraph &)");
              }
              pppEVar6 = std::
                         map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                         ::operator[](this_00,(key_type *)&local_40);
              *pppEVar6 = &pLVar7->value;
            }
          }
          SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ::
          IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
          ::operator++((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                        *)local_70);
        }
      }
    }
    _Var4._M_node = (_Base_ptr)&(_Var4._M_node)->_M_parent;
  } while( true );
}

Assistant:

void computeGetsAndPhis(LocalGraph& graph) {
    FindAll<LocalGet> gets(func->body);
    for (auto* get : gets.list) {
      auto& sets = graph.getSetses[get];
      if (sets.size() == 0) {
        continue; // unreachable, ignore
      }
      if (sets.size() == 1) {
        // easy, just one set, use its index
        auto* set = *sets.begin();
        if (set) {
          get->index = set->index;
        } else {
          // no set, assign param or zero
          if (func->isParam(get->index)) {
            // leave it, it's fine
          } else if (LiteralUtils::canMakeZero(get->type)) {
            // zero it out
            (*graph.locations[get]) =
              LiteralUtils::makeZero(get->type, *module);
          } else {
            // No zero exists here, so this is a nondefaultable type. The
            // default won't be used anyhow, so this value does not really
            // matter and we have nothing to do.
          }
        }
        continue;
      }
      if (!allowMerges) {
        continue;
      }
      // more than 1 set, need a phi: a new local written to at each of the sets
      auto new_ = addLocal(get->type);
      auto old = get->index;
      get->index = new_;
      Builder builder(*module);
      // write to the local in each of our sets
      for (auto* set : sets) {
        if (set) {
          // a set exists, just add a tee of its value
          auto* value = set->value;
          auto* tee = builder.makeLocalTee(new_, value, get->type);
          set->value = tee;
          // the value may have been something we tracked the location
          // of. if so, update that, since we moved it into the tee
          if (graph.locations.count(value) > 0) {
            assert(graph.locations[value] == &set->value);
            graph.locations[value] = &tee->value;
          }
        } else {
          // this is a param or the zero init value.
          if (func->isParam(old)) {
            // we add a set with the proper
            // param value at the beginning of the function
            auto* set = builder.makeLocalSet(
              new_, builder.makeLocalGet(old, func->getLocalType(old)));
            functionPrepends.push_back(set);
          } else {
            // this is a zero init, so we don't need to do anything actually
          }
        }
      }
    }
  }